

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>::grow
          (SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> *this,
          size_t MinSize)

{
  SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> *__ptr;
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                 ).super_SmallVectorBase.Capacity + 2;
  uVar3 = uVar1 >> 1 | uVar1;
  uVar3 = uVar3 >> 2 | uVar3;
  uVar3 = uVar3 >> 4 | uVar3;
  uVar3 = uVar3 >> 8 | uVar3;
  uVar1 = (uVar1 >> 0x20 | uVar3 >> 0x10 | uVar3) + 1;
  if (uVar1 <= MinSize) {
    uVar1 = MinSize;
  }
  if (0xfffffffe < uVar1) {
    uVar1 = 0xffffffff;
  }
  pvVar2 = malloc(uVar1 * 4);
  if (pvVar2 == (void *)0x0) {
    report_bad_alloc_error("Allocation failed",true);
  }
  __ptr = (SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> *)
          (this->super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
          ).super_SmallVectorBase.BeginX;
  uVar3 = (ulong)(this->
                 super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                 ).super_SmallVectorBase.Size;
  if (uVar3 != 0) {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pvVar2 + lVar4) =
           *(undefined4 *)
            ((long)&(__ptr->
                    super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                    ).super_SmallVectorBase.BeginX + lVar4);
      lVar4 = lVar4 + 4;
    } while (uVar3 << 2 != lVar4);
  }
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>).
  super_SmallVectorBase.BeginX = pvVar2;
  (this->super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>).
  super_SmallVectorBase.Capacity = (uint)uVar1;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}